

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

string * __thiscall
duckdb::BindContext::GetActualColumnName
          (string *__return_storage_ptr__,BindContext *this,BindingAlias *binding_alias,
          string *column_name)

{
  Binding *binding_00;
  InternalException *this_00;
  string *psVar1;
  BindContext *this_01;
  allocator local_119;
  optional_ptr<duckdb::Binding,_true> binding;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  ErrorData error;
  
  ErrorData::ErrorData(&error);
  this_01 = (BindContext *)binding_alias;
  binding = GetBinding(this,binding_alias,&error);
  if (binding.ptr != (Binding *)0x0) {
    binding_00 = optional_ptr<duckdb::Binding,_true>::operator*(&binding);
    GetActualColumnName(__return_storage_ptr__,this_01,binding_00,column_name);
    ErrorData::~ErrorData(&error);
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_d0,"No binding with name \"%s\": %s",&local_119);
  psVar1 = BindingAlias::GetAlias_abi_cxx11_(binding_alias);
  ::std::__cxx11::string::string((string *)&local_f0,(string *)psVar1);
  ::std::__cxx11::string::string((string *)&local_110,(string *)&error.raw_message);
  InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_d0,&local_f0,&local_110);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string BindContext::GetActualColumnName(const BindingAlias &binding_alias, const string &column_name) {
	ErrorData error;
	auto binding = GetBinding(binding_alias, error);
	if (!binding) {
		throw InternalException("No binding with name \"%s\": %s", binding_alias.GetAlias(), error.RawMessage());
	}
	return GetActualColumnName(*binding, column_name);
}